

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.h
# Opt level: O0

void __thiscall libchars::edit_object::~edit_object(edit_object *this)

{
  char *local_18;
  char *p;
  edit_object *this_local;
  
  this->_vptr_edit_object = (_func_int **)&PTR__edit_object_00149cd8;
  if (this->buflen != 0) {
    local_18 = this->buffer + (this->buflen - 1);
    while (this->buflen != 0) {
      *local_18 = '\0';
      this->buflen = this->buflen - 1;
      local_18 = local_18 + -1;
    }
  }
  std::__cxx11::string::~string((string *)&this->prompt);
  return;
}

Assistant:

virtual ~edit_object() {
            // securely wipe contents of buffer
            if (buflen > 0) {
                volatile char *p = buffer + buflen - 1;
                while (buflen > 0) {
                    *p-- = 0;
                    --buflen;
                }
            }
        }